

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O2

string_t duckdb::DatePart::PartOperator<duckdb::DayNameOperator>::
         Operation<duckdb::date_t,duckdb::string_t>
                   (date_t input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  bool bVar1;
  anon_union_16_2_67f50693_for_value aVar2;
  
  bVar1 = Value::IsFinite<duckdb::date_t>(input);
  if (bVar1) {
    aVar2.pointer =
         (anon_struct_16_3_d7536bce_for_pointer)
         DayNameOperator::Operation<duckdb::date_t,duckdb::string_t>(input);
  }
  else {
    TemplatedValidityMask<unsigned_long>::SetInvalid
              (&mask->super_TemplatedValidityMask<unsigned_long>,idx);
    aVar2 = (anon_union_16_2_67f50693_for_value)ZEXT816(0);
  }
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar2.pointer;
}

Assistant:

static inline TR Operation(TA input, ValidityMask &mask, idx_t idx, void *dataptr) {
			if (Value::IsFinite(input)) {
				return OP::template Operation<TA, TR>(input);
			} else {
				mask.SetInvalid(idx);
				return TR();
			}
		}